

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpServer.cpp
# Opt level: O0

void __thiscall sing::HttpServer::start(HttpServer *this)

{
  int iVar1;
  bool bVar2;
  HttpContext *pHVar3;
  pointer pEVar4;
  pointer pTVar5;
  pointer pTVar6;
  int local_1bc;
  int local_184;
  HttpServer *local_170;
  code *local_168;
  undefined8 local_160;
  type local_158;
  HttpServer *local_138;
  code *local_130;
  undefined8 local_128;
  type local_120;
  function<void_()> local_100;
  int local_dc;
  HttpServer *pHStack_d8;
  int t_1;
  code *local_d0;
  undefined8 local_c8;
  type local_c0;
  HttpServer *local_a0;
  code *local_98;
  undefined8 local_90;
  type local_88;
  function<void_()> local_68;
  int local_44;
  int local_40;
  int t;
  int fd;
  uint32_t events;
  HttpContext *context;
  int i;
  int ev_num;
  int timeMs;
  HttpContext *local_18;
  HttpContext *listenContext;
  HttpServer *this_local;
  
  listenContext = (HttpContext *)this;
  pHVar3 = (HttpContext *)operator_new(0x288);
  HttpContext::HttpContext(pHVar3,this->listenfd);
  local_18 = pHVar3;
  pEVar4 = std::unique_ptr<sing::Epoll,_std::default_delete<sing::Epoll>_>::operator->
                     (&this->epoller);
  bVar2 = Epoll::addFd(pEVar4,this->listenfd,local_18,0x80000001);
  if (!bVar2) {
    __assert_fail("epoller->addFd(listenfd, listenContext, (EPOLLIN | EPOLLET))==true",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MisakiOfScut[P]SingHttpServer/src/Http/HttpServer.cpp"
                  ,0x23,"void sing::HttpServer::start()");
  }
  do {
    pTVar5 = std::unique_ptr<sing::TimerManager,_std::default_delete<sing::TimerManager>_>::
             operator->(&this->timerManager);
    i = TimerManager::getNextTimeout(pTVar5);
    pEVar4 = std::unique_ptr<sing::Epoll,_std::default_delete<sing::Epoll>_>::operator->
                       (&this->epoller);
    context._4_4_ = Epoll::wait(pEVar4,(void *)(ulong)(uint)i);
    for (context._0_4_ = 0; (int)context < context._4_4_; context._0_4_ = (int)context + 1) {
      pEVar4 = std::unique_ptr<sing::Epoll,_std::default_delete<sing::Epoll>_>::operator->
                         (&this->epoller);
      _fd = Epoll::getDataPtr(pEVar4,(int)context);
      pEVar4 = std::unique_ptr<sing::Epoll,_std::default_delete<sing::Epoll>_>::operator->
                         (&this->epoller);
      t = Epoll::getEvents(pEVar4,(int)context);
      local_40 = HttpContext::getFd(_fd);
      if (local_40 == this->listenfd) {
        acceptConnection(this);
      }
      else if ((t & 0x2018U) == 0) {
        if ((t & 1U) == 0) {
          if ((t & 4U) == 0) {
            syslog(0x20,"Epoll: Unexpected event");
          }
          else {
            bVar2 = HttpContext::keepAlive(_fd);
            if (bVar2) {
              local_1bc = 300000;
            }
            else {
              local_1bc = this->timeout;
            }
            local_dc = local_1bc;
            pTVar5 = std::unique_ptr<sing::TimerManager,_std::default_delete<sing::TimerManager>_>::
                     operator->(&this->timerManager);
            pHVar3 = _fd;
            iVar1 = local_dc;
            local_130 = closeConnection;
            local_128 = 0;
            local_138 = this;
            std::
            bind<void(sing::HttpServer::*)(sing::HttpContext*),sing::HttpServer*,sing::HttpContext*&>
                      (&local_120,(offset_in_HttpServer_to_subr *)&local_130,&local_138,
                       (HttpContext **)&fd);
            std::function<void()>::
            function<std::_Bind<void(sing::HttpServer::*(sing::HttpServer*,sing::HttpContext*))(sing::HttpContext*)>,void>
                      ((function<void()> *)&local_100,&local_120);
            TimerManager::addTimer(pTVar5,pHVar3,iVar1,&local_100);
            std::function<void_()>::~function(&local_100);
            pTVar6 = std::unique_ptr<sing::ThreadPool,_std::default_delete<sing::ThreadPool>_>::
                     operator->(&this->threadPool);
            local_168 = doResponse;
            local_160 = 0;
            local_170 = this;
            std::
            bind<void(sing::HttpServer::*)(sing::HttpContext*),sing::HttpServer*,sing::HttpContext*&>
                      (&local_158,(offset_in_HttpServer_to_subr *)&local_168,&local_170,
                       (HttpContext **)&fd);
            ThreadPool::
            pushTask<std::_Bind<void(sing::HttpServer::*(sing::HttpServer*,sing::HttpContext*))(sing::HttpContext*)>>
                      (pTVar6,&local_158);
          }
        }
        else {
          bVar2 = HttpContext::keepAlive(_fd);
          if (bVar2) {
            local_184 = 300000;
          }
          else {
            local_184 = this->timeout;
          }
          local_44 = local_184;
          pTVar5 = std::unique_ptr<sing::TimerManager,_std::default_delete<sing::TimerManager>_>::
                   operator->(&this->timerManager);
          pHVar3 = _fd;
          iVar1 = local_44;
          local_98 = closeConnection;
          local_90 = 0;
          local_a0 = this;
          std::
          bind<void(sing::HttpServer::*)(sing::HttpContext*),sing::HttpServer*,sing::HttpContext*&>
                    (&local_88,(offset_in_HttpServer_to_subr *)&local_98,&local_a0,
                     (HttpContext **)&fd);
          std::function<void()>::
          function<std::_Bind<void(sing::HttpServer::*(sing::HttpServer*,sing::HttpContext*))(sing::HttpContext*)>,void>
                    ((function<void()> *)&local_68,&local_88);
          TimerManager::addTimer(pTVar5,pHVar3,iVar1,&local_68);
          std::function<void_()>::~function(&local_68);
          pTVar6 = std::unique_ptr<sing::ThreadPool,_std::default_delete<sing::ThreadPool>_>::
                   operator->(&this->threadPool);
          local_d0 = doRequest;
          local_c8 = 0;
          pHStack_d8 = this;
          std::
          bind<void(sing::HttpServer::*)(sing::HttpContext*),sing::HttpServer*,sing::HttpContext*&>
                    (&local_c0,(offset_in_HttpServer_to_subr *)&local_d0,&stack0xffffffffffffff28,
                     (HttpContext **)&fd);
          ThreadPool::
          pushTask<std::_Bind<void(sing::HttpServer::*(sing::HttpServer*,sing::HttpContext*))(sing::HttpContext*)>>
                    (pTVar6,&local_c0);
        }
      }
      else {
        closeConnection(this,_fd);
      }
    }
    pTVar5 = std::unique_ptr<sing::TimerManager,_std::default_delete<sing::TimerManager>_>::
             operator->(&this->timerManager);
    TimerManager::tick(pTVar5);
  } while( true );
}

Assistant:

void HttpServer::start(){
    HttpContext *listenContext = new HttpContext(listenfd);
    assert(epoller->addFd(listenfd, listenContext, (EPOLLIN | EPOLLET))==true);

    int timeMs;
    while (1)
    {
        timeMs = timerManager->getNextTimeout();
        int ev_num = epoller->wait(timeMs);
        for (int i = 0; i < ev_num; ++i)
        {
            HttpContext* context = epoller->getDataPtr(i); //maybe NULL
            uint32_t events = epoller->getEvents(i);
            int fd = context->getFd();

            if(fd==listenfd){
                acceptConnection();
            }
            else if(events & (EPOLLRDHUP | EPOLLHUP | EPOLLERR)){
                closeConnection(context);
            }
            else if(events & EPOLLIN){
                int t = context->keepAlive() ? 5*60*1000 : timeout;
                timerManager->addTimer(context, t, std::bind(&HttpServer::closeConnection, this, context));
                threadPool->pushTask(std::bind(&HttpServer::doRequest, this, context));
            }
            else if(events & EPOLLOUT){
                int t = context->keepAlive() ? 5*60*1000 : timeout;
                timerManager->addTimer(context, t, std::bind(&HttpServer::closeConnection, this, context));
                threadPool->pushTask(std::bind(&HttpServer::doResponse, this, context));
            }
            else{
                syslog(LOG_PERROR, "Epoll: Unexpected event");
            }
        }
        timerManager->tick();
    }
}